

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O2

void hta::
     throw_exception<hta::Exception,char_const*,std::filesystem::__cxx11::path,char_const*,char_const*>
               (char *args,path *args_1,char *args_2,char *args_3)

{
  Exception *this;
  string sStack_1f8;
  path local_1d8;
  stringstream msg;
  
  std::__cxx11::stringstream::stringstream((stringstream *)&msg);
  std::filesystem::__cxx11::path::path(&local_1d8,args_1);
  detail::make_exception<const_char_*,_std::filesystem::__cxx11::path,_const_char_*,_const_char_*>::
  operator()((make_exception<const_char_*,_std::filesystem::__cxx11::path,_const_char_*,_const_char_*>
              *)&sStack_1f8,&msg,args,&local_1d8,args_2,args_3);
  std::filesystem::__cxx11::path::~path(&local_1d8);
  this = (Exception *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  Exception::Exception(this,&sStack_1f8);
  __cxa_throw(this,&Exception::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

[[noreturn]] inline void throw_exception(Args... args)
{
    std::stringstream msg;

    detail::make_exception<Args...>()(msg, args...);

    throw E(msg.str());
}